

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

UNumberUnitWidth icu_63::number::impl::stem_to_object::unitWidth(StemEnum stem)

{
  UNumberUnitWidth UVar1;
  
  UVar1 = UNUM_UNIT_WIDTH_COUNT;
  if (stem - 0x1a < UNUM_UNIT_WIDTH_COUNT) {
    UVar1 = stem - 0x1a;
  }
  return UVar1;
}

Assistant:

UNumberUnitWidth stem_to_object::unitWidth(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_UNIT_WIDTH_NARROW:
            return UNUM_UNIT_WIDTH_NARROW;
        case STEM_UNIT_WIDTH_SHORT:
            return UNUM_UNIT_WIDTH_SHORT;
        case STEM_UNIT_WIDTH_FULL_NAME:
            return UNUM_UNIT_WIDTH_FULL_NAME;
        case STEM_UNIT_WIDTH_ISO_CODE:
            return UNUM_UNIT_WIDTH_ISO_CODE;
        case STEM_UNIT_WIDTH_HIDDEN:
            return UNUM_UNIT_WIDTH_HIDDEN;
        default:
            return UNUM_UNIT_WIDTH_COUNT; // for objects, throw; for enums, return COUNT
    }
}